

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O0

void __thiscall wasm::Instrumenter::addGlobals(Instrumenter *this,size_t numFuncs)

{
  Module *module;
  bool bVar1;
  reference pNVar2;
  Name *name;
  iterator __end1;
  iterator __begin1;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range1;
  anon_class_8_1_8991fb9c local_48;
  anon_class_8_1_8991fb9c addGlobal;
  string_view local_38;
  string_view local_28;
  size_t local_18;
  size_t numFuncs_local;
  Instrumenter *this_local;
  
  if (this->config->storageKind == InGlobals) {
    module = this->wasm;
    local_18 = numFuncs;
    numFuncs_local = (size_t)this;
    Name::Name((Name *)&local_38,"monotonic_counter");
    local_28 = (string_view)Names::getValidGlobalName(module,(Name)local_38);
    Name::operator=(&this->counterGlobal,(Name *)&local_28);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve(&this->functionGlobals,local_18);
    addGlobal.this = this;
    ModuleUtils::iterDefinedFunctions<wasm::Instrumenter::addGlobals(unsigned_long)::__0>
              (this->wasm,(anon_class_8_1_8991fb9c)this);
    local_48.this = this;
    addGlobals::anon_class_8_1_8991fb9c::operator()
              (&local_48,(Name)(this->counterGlobal).super_IString.str);
    __end1 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(&this->functionGlobals);
    name = (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end(&this->functionGlobals)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                       *)&name), bVar1) {
      pNVar2 = __gnu_cxx::
               __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
               ::operator*(&__end1);
      addGlobals::anon_class_8_1_8991fb9c::operator()(&local_48,(Name)(pNVar2->super_IString).str);
      __gnu_cxx::
      __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
      operator++(&__end1);
    }
  }
  return;
}

Assistant:

void Instrumenter::addGlobals(size_t numFuncs) {
  if (config.storageKind != WasmSplitOptions::StorageKind::InGlobals) {
    // Don't need globals
    return;
  }
  // Create fresh global names (over-reserves, but that's ok)
  counterGlobal = Names::getValidGlobalName(*wasm, "monotonic_counter");
  functionGlobals.reserve(numFuncs);
  ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
    functionGlobals.push_back(
      Names::getValidGlobalName(*wasm, func->name.toString() + "_timestamp"));
  });

  // Create and add new globals
  auto addGlobal = [&](Name name) {
    auto global = Builder::makeGlobal(
      name,
      Type::i32,
      Builder(*wasm).makeConst(Literal::makeZero(Type::i32)),
      Builder::Mutable);
    global->hasExplicitName = true;
    wasm->addGlobal(std::move(global));
  };
  addGlobal(counterGlobal);
  for (auto& name : functionGlobals) {
    addGlobal(name);
  }
}